

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_pthreads.c
# Opt level: O0

LOCK_RESULT Lock(LOCK_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  int return_code;
  LOGGER_LOG l;
  LOCK_RESULT result;
  LOCK_HANDLE handle_local;
  
  if (handle == (LOCK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/lock_pthreads.c"
                ,"Lock",0x25,1,"Invalid argument; handle is NULL.");
    }
    l._4_4_ = LOCK_ERROR;
  }
  else {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)handle);
    if (iVar1 == 0) {
      l._4_4_ = LOCK_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/lock_pthreads.c"
                  ,"Lock",0x33,1,"pthread_mutex_lock failed (%d).",iVar1);
      }
      l._4_4_ = LOCK_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

LOCK_RESULT Lock(LOCK_HANDLE handle)
{
    LOCK_RESULT result;
    if (handle == NULL)
    {
        /* Codes_SRS_LOCK_10_007: [Lock on NULL handle passed returns LOCK_ERROR] */
        LogError("Invalid argument; handle is NULL.");
        result = LOCK_ERROR;
    }
    else
    {
        int return_code = pthread_mutex_lock((pthread_mutex_t*)handle);
        if (return_code == 0)
        {
            /* Codes_SRS_LOCK_10_005: [Lock on success shall return LOCK_OK] */
            result = LOCK_OK;
        }
        else
        {
            /* Codes_SRS_LOCK_10_006: [Lock on error shall return LOCK_ERROR] */
            LogError("pthread_mutex_lock failed (%d).", return_code);
            result = LOCK_ERROR;
        }
    }

    return result;
}